

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void __thiscall MasterObjectHolder::clearCore(MasterObjectHolder *this,int index)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar3;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar4;
  ulong uVar5;
  _Map_pointer ppuVar6;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar7;
  ulong uVar8;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *this_00;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  handle coreList;
  unique_lock<std::mutex> local_30;
  
  uVar5 = (ulong)(uint)index;
  local_30._M_device = &(this->cores).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  ppuVar1 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar6 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  if ((index < 0) ||
     (puVar2 = (this->cores).m_obj.
               super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (int)((int)((ulong)((long)(this->cores).m_obj.
                               super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar2) >> 3
                ) + (int)((ulong)((long)(this->cores).m_obj.
                                        super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->cores).m_obj.
                                       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)ppuVar1 - (int)ppuVar6) >> 3) - 1) + (uint)(ppuVar1 == (_Map_pointer)0x0))
          * 0x40) <= index)) goto LAB_0019a719;
  uVar8 = ((long)puVar2 -
           (long)(this->cores).m_obj.
                 super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar5;
  if (uVar8 < 0x40) {
    puVar7 = puVar2 + uVar5;
  }
  else {
    uVar9 = uVar8 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar8) {
      uVar9 = uVar8 >> 6;
    }
    puVar7 = ppuVar6[uVar9] + uVar8 + uVar9 * -0x40;
  }
  ((puVar7->_M_t).
   super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
   super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
   super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl)->valid = 0;
  if (uVar8 < 0x40) {
    this_00 = (__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
              (puVar2 + uVar5);
  }
  else {
    uVar5 = uVar8 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar8) {
      uVar5 = uVar8 >> 6;
    }
    this_00 = (__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
              (ppuVar6[uVar5] + uVar8 + uVar5 * -0x40);
  }
  std::__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::reset
            (this_00,(pointer)0x0);
  ppuVar1 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar6 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar6) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0)) *
           0x40;
  puVar3 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  lVar10 = (long)puVar3 -
           (long)(this->cores).m_obj.
                 super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
  puVar4 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar7 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  lVar12 = (long)puVar7 - (long)puVar4 >> 3;
  if ((ulong)(lVar10 + lVar12 + lVar11) < 0xb) goto LAB_0019a719;
  lVar11 = lVar11 + lVar10 + lVar12 >> 2;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019a70f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019a70f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019a70f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      if ((puVar4->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019a70f;
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  lVar10 = lVar10 + (((ulong)((long)ppuVar1 - (long)ppuVar6) >> 3) -
                    (ulong)(ppuVar1 != (_Map_pointer)0x0)) * 0x40 +
           ((long)puVar7 - (long)puVar4 >> 3);
  if (lVar10 == 1) {
LAB_0019a706:
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
LAB_0019a70c:
      puVar4 = puVar3;
    }
  }
  else if (lVar10 == 2) {
LAB_0019a6f3:
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
      }
      goto LAB_0019a706;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_0019a70c;
    if ((puVar4->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
      puVar4 = puVar4 + 1;
      if (puVar4 == puVar7) {
        puVar4 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar7 = puVar4 + 0x40;
      }
      goto LAB_0019a6f3;
    }
  }
LAB_0019a70f:
  if (puVar3 == puVar4) {
    std::
    deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
    ::clear(&(this->cores).m_obj);
  }
LAB_0019a719:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void MasterObjectHolder::clearCore(int index)
{
    auto coreList = cores.lock();
    if ((index < static_cast<int>(coreList->size())) && (index >= 0)) {
        (*coreList)[index]->valid = 0;
        (*coreList)[index] = nullptr;
        if (coreList->size() > 10) {
            if (std::none_of(coreList->begin(), coreList->end(), [](const auto& core) { return static_cast<bool>(core); })) {
                coreList->clear();
            }
        }
    }
}